

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederate.cpp
# Opt level: O0

Endpoint * __thiscall
helics::MessageFederate::getEndpoint(MessageFederate *this,string_view eptName)

{
  string_view addition;
  string_view name;
  string_view name_00;
  bool bVar1;
  pointer this_00;
  char *in_RDX;
  Federate *in_RSI;
  MessageFederateManager *in_RDI;
  Endpoint *ept;
  char *in_stack_ffffffffffffff98;
  Endpoint *local_8;
  
  std::
  unique_ptr<helics::MessageFederateManager,_std::default_delete<helics::MessageFederateManager>_>::
  operator->((unique_ptr<helics::MessageFederateManager,_std::default_delete<helics::MessageFederateManager>_>
              *)0x26dd05);
  name._M_str = in_RDX;
  name._M_len = (size_t)in_RSI;
  local_8 = MessageFederateManager::getEndpoint(in_RDI,name);
  bVar1 = Interface::isValid((Interface *)0x26dd46);
  if (!bVar1) {
    this_00 = std::
              unique_ptr<helics::MessageFederateManager,_std::default_delete<helics::MessageFederateManager>_>
              ::operator->((unique_ptr<helics::MessageFederateManager,_std::default_delete<helics::MessageFederateManager>_>
                            *)0x26dd5c);
    addition._M_str = in_stack_ffffffffffffff98;
    addition._M_len = (size_t)in_RDX;
    Federate::localNameGenerator_abi_cxx11_(in_RSI,addition);
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
    name_00._M_str = in_RDX;
    name_00._M_len = (size_t)in_RSI;
    local_8 = MessageFederateManager::getEndpoint(in_RDI,name_00);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  }
  return local_8;
}

Assistant:

Endpoint& MessageFederate::getEndpoint(std::string_view eptName) const
{
    auto& ept = mfManager->getEndpoint(eptName);
    if (!ept.isValid()) {
        return mfManager->getEndpoint(localNameGenerator(eptName));
    }
    return ept;
}